

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.cpp
# Opt level: O2

string * __thiscall
pbrt::SubsurfaceMaterial::ToString_abi_cxx11_
          (string *__return_storage_ptr__,SubsurfaceMaterial *this)

{
  bool *in_RAX;
  
  StringPrintf<pbrt::FloatTextureHandle_const&,float_const&,pbrt::SpectrumTextureHandle_const&,pbrt::SpectrumTextureHandle_const&,pbrt::SpectrumTextureHandle_const&,pbrt::SpectrumTextureHandle_const&,pbrt::FloatTextureHandle_const&,pbrt::FloatTextureHandle_const&,float_const&,bool_const&>
            (__return_storage_ptr__,
             (pbrt *)
             "[ SubsurfaceMaterial displacment: %s scale: %f sigma_a: %s sigma_s: %s reflectance: %s mfp: %s uRoughness: %s vRoughness: %s eta: %f remapRoughness: %s ]"
             ,(char *)this,(FloatTextureHandle *)&this->scale,(float *)&this->sigma_a,&this->sigma_s
             ,&this->reflectance,&this->mfp,(SpectrumTextureHandle *)&this->uRoughness,
             &this->vRoughness,(FloatTextureHandle *)&this->eta,(float *)&this->remapRoughness,
             in_RAX);
  return __return_storage_ptr__;
}

Assistant:

std::string SubsurfaceMaterial::ToString() const {
    return StringPrintf("[ SubsurfaceMaterial displacment: %s scale: %f "
                        "sigma_a: %s sigma_s: %s "
                        "reflectance: %s mfp: %s uRoughness: %s vRoughness: %s "
                        "eta: %f remapRoughness: %s ]",
                        displacement, scale, sigma_a, sigma_s, reflectance, mfp,
                        uRoughness, vRoughness, eta, remapRoughness);
}